

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O2

OnConflictAction duckdb::TransformOnConflictAction(PGOnConflictClause *on_conflict)

{
  PGOnConflictAction PVar1;
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if (on_conflict == (PGOnConflictClause *)0x0) {
    PVar1 = PG_ONCONFLICT_NONE;
  }
  else {
    PVar1 = on_conflict->action;
    if (PG_ONCONFLICT_UPDATE < PVar1) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Type not implemented for OnConflictAction",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (OnConflictAction)PVar1;
}

Assistant:

OnConflictAction TransformOnConflictAction(duckdb_libpgquery::PGOnConflictClause *on_conflict) {
	if (!on_conflict) {
		return OnConflictAction::THROW;
	}
	switch (on_conflict->action) {
	case duckdb_libpgquery::PG_ONCONFLICT_NONE:
		return OnConflictAction::THROW;
	case duckdb_libpgquery::PG_ONCONFLICT_NOTHING:
		return OnConflictAction::NOTHING;
	case duckdb_libpgquery::PG_ONCONFLICT_UPDATE:
		return OnConflictAction::UPDATE;
	default:
		throw InternalException("Type not implemented for OnConflictAction");
	}
}